

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTF2Exporter::glTF2Exporter
          (glTF2Exporter *this,char *filename,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *pProperties,bool isBinary)

{
  Asset *this_00;
  element_type *peVar1;
  undefined1 local_b8 [8];
  AssetWriter writer;
  bool isBinary_local;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *filename_local;
  glTF2Exporter *this_local;
  
  this->mFilename = filename;
  this->mIOSystem = pIOSystem;
  this->mProperties = pProperties;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->mTexturesByPath);
  std::shared_ptr<glTF2::Asset>::shared_ptr(&this->mAsset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mBodyData);
  this->mScene = pScene;
  this_00 = (Asset *)operator_new(0xa10);
  glTF2::Asset::Asset(this_00,pIOSystem);
  std::__shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>::reset<glTF2::Asset>
            (&(this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>,this_00);
  if (isBinary) {
    peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    glTF2::Asset::SetAsBinary(peVar1);
  }
  ExportMetadata(this);
  ExportMaterials(this);
  if (this->mScene->mRootNode != (aiNode *)0x0) {
    ExportNodeHierarchy(this,this->mScene->mRootNode);
  }
  ExportMeshes(this);
  MergeMeshes(this);
  ExportScene(this);
  ExportAnimations(this);
  peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &this->mAsset);
  glTF2::AssetWriter::AssetWriter((AssetWriter *)local_b8,peVar1);
  if (isBinary) {
    glTF2::AssetWriter::WriteGLBFile((AssetWriter *)local_b8,filename);
  }
  else {
    glTF2::AssetWriter::WriteFile((AssetWriter *)local_b8,filename);
  }
  glTF2::AssetWriter::~AssetWriter((AssetWriter *)local_b8);
  return;
}

Assistant:

glTF2Exporter::glTF2Exporter(const char* filename, IOSystem* pIOSystem, const aiScene* pScene,
                           const ExportProperties* pProperties, bool isBinary)
    : mFilename(filename)
    , mIOSystem(pIOSystem)
    , mProperties(pProperties)
{
    mScene = pScene;

    mAsset.reset( new Asset( pIOSystem ) );

    if (isBinary) {
        mAsset->SetAsBinary();
    }

    ExportMetadata();

    ExportMaterials();

    if (mScene->mRootNode) {
        ExportNodeHierarchy(mScene->mRootNode);
    }

    ExportMeshes();
    MergeMeshes();

    ExportScene();

    ExportAnimations();

    AssetWriter writer(*mAsset);

    if (isBinary) {
        writer.WriteGLBFile(filename);
    } else {
        writer.WriteFile(filename);
    }
}